

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O3

ASTContext * __thiscall
slang::ast::ASTContext::resetFlags
          (ASTContext *__return_storage_ptr__,ASTContext *this,
          bitmask<slang::ast::ASTFlags> addedFlags)

{
  Scope *pSVar1;
  Symbol *pSVar2;
  TempVarSymbol *pTVar3;
  RandomizeDetails *pRVar4;
  SymbolIndex SVar5;
  undefined4 uVar6;
  
  pSVar1 = (this->scope).ptr;
  SVar5 = this->lookupIndex;
  uVar6 = *(undefined4 *)&this->field_0xc;
  pSVar2 = this->instanceOrProc;
  pTVar3 = this->firstTempVar;
  pRVar4 = this->randomizeDetails;
  (__return_storage_ptr__->flags).m_bits = (this->flags).m_bits;
  __return_storage_ptr__->instanceOrProc = pSVar2;
  __return_storage_ptr__->assertionInstance = this->assertionInstance;
  __return_storage_ptr__->firstTempVar = pTVar3;
  __return_storage_ptr__->randomizeDetails = pRVar4;
  (__return_storage_ptr__->scope).ptr = pSVar1;
  __return_storage_ptr__->lookupIndex = SVar5;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = uVar6;
  (__return_storage_ptr__->flags).m_bits =
       (__return_storage_ptr__->flags).m_bits & 0x1fdefffd7c72 | addedFlags.m_bits;
  return __return_storage_ptr__;
}

Assistant:

ASTContext ASTContext::resetFlags(bitmask<ASTFlags> addedFlags) const {
    // Remove non-sticky flags, add in any extras specified by addedFlags
    static constexpr bitmask<ASTFlags> NonSticky =
        ASTFlags::InsideConcatenation | ASTFlags::AllowDataType | ASTFlags::AssignmentAllowed |
        ASTFlags::StreamingAllowed | ASTFlags::TopLevelStatement | ASTFlags::AllowUnboundedLiteral |
        ASTFlags::AllowTypeReferences | ASTFlags::AllowClockingBlock | ASTFlags::NotADriver |
        ASTFlags::AssertionDefaultArg;

    ASTContext result(*this);
    result.flags &= ~NonSticky;
    result.flags |= addedFlags;
    return result;
}